

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  uint32 uVar1;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    internal::ExtensionSet::SetRepeatedEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),index,value);
    return;
  }
  uVar1 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  *(int *)(*(long *)((long)&message[1].super_MessageLite._vptr_MessageLite + (ulong)uVar1) +
          (long)index * 4) = value;
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValueInternal(Message* message,
                                              const FieldDescriptor* field,
                                              int index, int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(field->number(), index,
                                                  value);
  } else {
    SetRepeatedField<int>(message, field, index, value);
  }
}